

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connect-unspecified.c
# Opt level: O2

int run_test_connect_unspecified(void)

{
  int iVar1;
  uv_loop_t *loop;
  short *psVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  undefined8 uVar7;
  int64_t eval_b_4;
  int64_t eval_b_5;
  sockaddr_in6 addr6;
  sockaddr_in addr4;
  uv_connect_t connect6;
  uv_connect_t connect4;
  uv_tcp_t socket6;
  uv_tcp_t socket4;
  
  loop = uv_default_loop();
  iVar1 = uv_tcp_init(loop,&socket4);
  socket6.data = (void *)(long)iVar1;
  connect4.data = (void *)0x0;
  if (socket6.data == (void *)0x0) {
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr4);
    socket6.data = (void *)(long)iVar1;
    connect4.data = (void *)0x0;
    if (socket6.data != (void *)0x0) {
      pcVar4 = "uv_ip4_addr(\"0.0.0.0\", 9123, &addr4)";
      uVar7 = 0x2d;
      goto LAB_001158b0;
    }
    iVar1 = uv_tcp_connect(&connect4,&socket4,(sockaddr *)&addr4,connect_4);
    socket6.data = (void *)(long)iVar1;
    connect6.data = (void *)0x0;
    if (socket6.data == (void *)0x0) {
      iVar1 = uv_interface_addresses((uv_interface_address_t **)&socket6,(int *)&connect6);
      if (iVar1 == 0) {
        psVar2 = (short *)((long)socket6.data + 0x14);
        bVar6 = false;
        for (lVar3 = 0; (!bVar6 && (lVar3 < (int)connect6.data)); lVar3 = lVar3 + 1) {
          bVar6 = *psVar2 == 10;
          psVar2 = psVar2 + 0x30;
        }
        uv_free_interface_addresses((uv_interface_address_t *)socket6.data,(int)connect6.data);
        if (bVar6) {
          iVar1 = uv_tcp_init(loop,&socket6);
          connect6.data = (void *)(long)iVar1;
          addr6.sin6_family = 0;
          addr6.sin6_port = 0;
          addr6.sin6_flowinfo = 0;
          if (connect6.data == (void *)0x0) {
            iVar1 = uv_ip6_addr("::",0x23a3,&addr6);
            connect6.data = (void *)(long)iVar1;
            if (connect6.data == (void *)0x0) {
              iVar1 = uv_tcp_connect(&connect6,&socket6,(sockaddr *)&addr6,connect_6);
              eval_b_4 = (int64_t)iVar1;
              eval_b_5 = 0;
              if ((void *)eval_b_4 != (void *)0x0) {
                pcVar5 = "0";
                pcVar4 = 
                "uv_tcp_connect(&connect6, &socket6, (const struct sockaddr*) &addr6, connect_6)";
                uVar7 = 0x39;
                goto LAB_0011596a;
              }
              goto LAB_001157d2;
            }
            pcVar4 = "uv_ip6_addr(\"::\", 9123, &addr6)";
            uVar7 = 0x35;
          }
          else {
            pcVar4 = "uv_tcp_init(loop, &socket6)";
            uVar7 = 0x34;
          }
          eval_b_5 = 0;
          pcVar5 = "0";
          eval_b_4 = (int64_t)connect6.data;
          goto LAB_0011596a;
        }
      }
LAB_001157d2:
      iVar1 = uv_run(loop,UV_RUN_DEFAULT);
      eval_b_4 = (int64_t)iVar1;
      eval_b_5 = 0;
      if ((void *)eval_b_4 == (void *)0x0) {
        uv_walk(loop,close_walk_cb,(void *)0x0);
        uv_run(loop,UV_RUN_DEFAULT);
        eval_b_4 = 0;
        iVar1 = uv_loop_close(loop);
        eval_b_5 = (int64_t)iVar1;
        if (eval_b_5 == 0) {
          uv_library_shutdown();
          return 0;
        }
        pcVar5 = "uv_loop_close(loop)";
        pcVar4 = "0";
        uVar7 = 0x3e;
      }
      else {
        pcVar5 = "0";
        pcVar4 = "uv_run(loop, UV_RUN_DEFAULT)";
        uVar7 = 0x3c;
      }
      goto LAB_0011596a;
    }
    pcVar4 = "uv_tcp_connect(&connect4, &socket4, (const struct sockaddr*) &addr4, connect_4)";
    uVar7 = 0x31;
  }
  else {
    pcVar4 = "uv_tcp_init(loop, &socket4)";
    uVar7 = 0x2c;
LAB_001158b0:
    connect4.data = (void *)0x0;
  }
  eval_b_5 = 0;
  pcVar5 = "0";
  eval_b_4 = (int64_t)socket6.data;
LAB_0011596a:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connect-unspecified.c"
          ,uVar7,pcVar4,"==",pcVar5,eval_b_4,"==",eval_b_5);
  abort();
}

Assistant:

TEST_IMPL(connect_unspecified) {
  uv_loop_t* loop;
  uv_tcp_t socket4;
  struct sockaddr_in addr4;
  uv_connect_t connect4;
  uv_tcp_t socket6;
  struct sockaddr_in6 addr6;
  uv_connect_t connect6;

  loop = uv_default_loop();

  ASSERT_OK(uv_tcp_init(loop, &socket4));
  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr4));
  ASSERT_OK(uv_tcp_connect(&connect4,
                           &socket4,
                           (const struct sockaddr*) &addr4,
                           connect_4));

  if (can_ipv6()) {
    ASSERT_OK(uv_tcp_init(loop, &socket6));
    ASSERT_OK(uv_ip6_addr("::", TEST_PORT, &addr6));
    ASSERT_OK(uv_tcp_connect(&connect6,
                             &socket6,
                             (const struct sockaddr*) &addr6,
                             connect_6));
  }

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}